

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

int __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::copy
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pSVar3;
  size_t size;
  undefined8 uVar4;
  byte *pbVar5;
  long lVar6;
  bool bVar7;
  
  if (this->len == 0) {
    return 0;
  }
  size = this->len * 0x18;
  pbVar5 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  if (*(byte **)(dst + 8) < pbVar5 + size) {
    pbVar5 = BumpAllocator::allocateSlow((BumpAllocator *)dst,size,8);
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar5 + size;
  }
  sVar2 = this->len;
  if (sVar2 != 0) {
    pSVar3 = this->data_;
    lVar6 = 0;
    do {
      *(undefined8 *)(pbVar5 + lVar6 + 0x10) =
           *(undefined8 *)
            ((long)&(pSVar3->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_int>._M_payload + lVar6);
      puVar1 = (undefined8 *)((long)&(pSVar3->operand).ptr + lVar6);
      uVar4 = puVar1[1];
      *(undefined8 *)(pbVar5 + lVar6) = *puVar1;
      *(undefined8 *)(pbVar5 + lVar6 + 8) = uVar4;
      bVar7 = sVar2 * 0x18 + -0x18 == lVar6;
      if (bVar7) break;
      lVar6 = lVar6 + 0x18;
    } while (!bVar7);
  }
  return (int)pbVar5;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }